

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_blancer.hpp
# Opt level: O2

int __thiscall
coro_io::load_blancer<cinatra::coro_http_client,_coro_io::io_context_pool>::WRRLoadBlancer::
get_max_weight_gcd(WRRLoadBlancer *this)

{
  int __m;
  int __n;
  int iVar1;
  int *piVar2;
  size_t i;
  ulong uVar3;
  
  piVar2 = (this->weights_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = *piVar2;
  for (uVar3 = 0;
      uVar3 < (ulong)((long)(this->weights_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar2 >> 2);
      uVar3 = uVar3 + 1) {
    __m = piVar2[uVar3];
    __n = iVar1;
    if (__m < iVar1) {
      __n = __m;
      __m = iVar1;
    }
    iVar1 = std::gcd<int,int>(__m,__n);
    piVar2 = (this->weights_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  return iVar1;
}

Assistant:

int get_max_weight_gcd() {
      int res = weights_[0];
      int cur_max = 0, cur_min = 0;
      for (size_t i = 0; i < weights_.size(); i++) {
        cur_max = (std::max)(res, weights_[i]);
        cur_min = (std::min)(res, weights_[i]);
        res = std::gcd(cur_max, cur_min);
      }
      return res;
    }